

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O3

StringTree * __thiscall
kj::StringTree::concat<kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>>
          (StringTree *__return_storage_ptr__,StringTree *this,ArrayPtr<const_char> *params,
          CappedArray<char,_14UL> *params_1,ArrayPtr<const_char> *params_2)

{
  char *pcVar1;
  long lVar2;
  Branch *pBVar3;
  char *pcVar4;
  String local_48;
  
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->text).content.disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
  (__return_storage_ptr__->text).content.ptr = (char *)0x0;
  (__return_storage_ptr__->text).content.size_ = 0;
  pcVar1 = params->ptr;
  pcVar4 = (this->text).content.ptr;
  lVar2 = *(long *)params_1->content;
  __return_storage_ptr__->size_ = (size_t)(pcVar1 + (long)(pcVar4 + lVar2));
  heapString(&local_48,(size_t)(pcVar1 + (long)(pcVar4 + lVar2)));
  (__return_storage_ptr__->text).content.ptr = local_48.content.ptr;
  (__return_storage_ptr__->text).content.size_ = local_48.content.size_;
  (__return_storage_ptr__->text).content.disposer = local_48.content.disposer;
  pBVar3 = (Branch *)
           _::HeapArrayDisposer::allocateImpl
                     (0x40,0,0,_::HeapArrayDisposer::Allocate_<kj::StringTree::Branch,_false,_false>
                               ::construct,
                      _::HeapArrayDisposer::Allocate_<kj::StringTree::Branch,_false,_false>::
                      destruct);
  pcVar1 = (this->text).content.ptr;
  (__return_storage_ptr__->branches).ptr = pBVar3;
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pcVar4 = local_48.content.ptr;
  if (local_48.content.size_ == 0) {
    pcVar4 = (char *)0x0;
  }
  if (pcVar1 != (char *)0x0) {
    memcpy(pcVar4,(void *)this->size_,(size_t)pcVar1);
    pcVar4 = pcVar4 + (long)pcVar1;
  }
  pcVar1 = params->ptr;
  if (pcVar1 != (char *)0x0) {
    memcpy(pcVar4,&params->size_,(size_t)pcVar1);
    pcVar4 = pcVar4 + (long)pcVar1;
  }
  if (*(size_t *)params_1->content != 0) {
    memcpy(pcVar4,(void *)params_1->currentSize,*(size_t *)params_1->content);
  }
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}